

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FieldDescriptor **ppFVar4;
  MessageOptions *pMVar5;
  char *pcVar6;
  size_type sVar7;
  reference ppEVar8;
  FieldGenerator *pFVar9;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar10;
  int local_10c;
  int local_108;
  int i_2;
  int j;
  int i_1;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  ExtensionRange **local_68;
  ExtensionRange **local_60;
  ExtensionRange *local_58 [3];
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  ppFVar4 = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,ppFVar4);
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            *)local_38);
  for (local_3c = 0; iVar3 = local_3c, iVar2 = Descriptor::extension_range_count(this->descriptor_),
      iVar3 < iVar2; local_3c = local_3c + 1) {
    local_58[0] = Descriptor::extension_range(this->descriptor_,local_3c);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_38,local_58);
  }
  local_60 = (ExtensionRange **)
             std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
  local_68 = (ExtensionRange **)
             std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>
            (local_60,local_68);
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"getSerializedSize();\n");
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar3) {
    pMVar5 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      bVar1 = HasDescriptorMethods(this->descriptor_);
      pcVar6 = "Lite";
      if (bVar1) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar6,&local_91);
      ClassName_abi_cxx11_(&local_b8,(java *)this->descriptor_,descriptor);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newMessageSetExtensionWriter();\n"
                         ,"lite",&local_90,"classname",&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    else {
      bVar1 = HasDescriptorMethods(this->descriptor_);
      pcVar6 = "Lite";
      if (bVar1) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar6,&local_d9);
      ClassName_abi_cxx11_((string *)&j,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newExtensionWriter();\n"
                         ,"lite",&local_d8,"classname",(string *)&j);
      std::__cxx11::string::~string((string *)&j);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
  }
  i_2 = 0;
  local_108 = 0;
  while( true ) {
    iVar3 = Descriptor::field_count(this->descriptor_);
    bVar1 = true;
    if (iVar3 <= i_2) {
      sVar7 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
      bVar1 = (ulong)(long)local_108 < sVar7;
    }
    if (!bVar1) break;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (i_2 == iVar3) {
      sVar7 = (size_type)local_108;
      local_108 = local_108 + 1;
      ppEVar8 = std::
                vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              *)local_38,sVar7);
      GenerateSerializeOneExtensionRange(this,printer,*ppEVar8);
    }
    else {
      sVar7 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
      if ((long)local_108 == sVar7) {
        lVar10 = (long)i_2;
        i_2 = i_2 + 1;
        ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar10);
        GenerateSerializeOneField(this,printer,*ppFVar4);
      }
      else {
        ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_2);
        iVar3 = FieldDescriptor::number(*ppFVar4);
        ppEVar8 = std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                *)local_38,(long)local_108);
        if (iVar3 < (*ppEVar8)->start) {
          lVar10 = (long)i_2;
          i_2 = i_2 + 1;
          ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                               &sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar10);
          GenerateSerializeOneField(this,printer,*ppFVar4);
        }
        else {
          sVar7 = (size_type)local_108;
          local_108 = local_108 + 1;
          ppEVar8 = std::
                    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                  *)local_38,sVar7);
          GenerateSerializeOneExtensionRange(this,printer,*ppEVar8);
        }
      }
    }
  }
  bVar1 = HasUnknownFields(this->descriptor_);
  if (bVar1) {
    pMVar5 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"getUnknownFields().writeAsMessageSetTo(output);\n");
    }
    else {
      io::Printer::Print(printer,"getUnknownFields().writeTo(output);\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\nprivate int memoizedSerializedSize = -1;\npublic int getSerializedSize() {\n  int size = memoizedSerializedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                    );
  io::Printer::Indent(printer);
  for (local_10c = 0; iVar3 = Descriptor::field_count(this->descriptor_), local_10c < iVar3;
      local_10c = local_10c + 1) {
    ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                         &sorted_extensions.
                          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_10c);
    pFVar9 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar4);
    (*pFVar9->_vptr_FieldGenerator[0xf])(pFVar9,printer);
  }
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar3) {
    pMVar5 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"size += extensionsSerializedSizeAsMessageSet();\n");
    }
    else {
      io::Printer::Print(printer,"size += extensionsSerializedSize();\n");
    }
  }
  bVar1 = HasUnknownFields(this->descriptor_);
  if (bVar1) {
    pMVar5 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"size += getUnknownFields().getSerializedSizeAsMessageSet();\n");
    }
    else {
      io::Printer::Print(printer,"size += getUnknownFields().getSerializedSize();\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  memoizedSerializedSize = size;\n  return size;\n}\n\n");
  io::Printer::Print(printer,
                     "private static final long serialVersionUID = 0L;\n@java.lang.Override\nprotected java.lang.Object writeReplace()\n    throws java.io.ObjectStreamException {\n  return super.writeReplace();\n}\n\n"
                    );
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             *)local_38);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeOrdering());

  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  // writeTo(CodedOutputStream output) might be invoked without
  // getSerializedSize() ever being called, but we need the memoized
  // sizes in case this message has packed fields. Rather than emit checks for
  // each packed field, just call getSerializedSize() up front for all messages.
  // In most cases, getSerializedSize() will have already been called anyway by
  // one of the wrapper writeTo() methods, making this call cheap.
  printer->Print(
    "getSerializedSize();\n");

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newMessageSetExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "getUnknownFields().writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "getUnknownFields().writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "private int memoizedSerializedSize = -1;\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSerializedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += getUnknownFields().getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += getUnknownFields().getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSerializedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");

  printer->Print(
    "private static final long serialVersionUID = 0L;\n"
    "@java.lang.Override\n"
    "protected java.lang.Object writeReplace()\n"
    "    throws java.io.ObjectStreamException {\n"
    "  return super.writeReplace();\n"
    "}\n"
    "\n");
}